

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

void __thiscall
PDA::Transducer::Generator::writeFunctionBody
          (Generator *this,wostream *stream,size_t startTokenIndex)

{
  bool bVar1;
  bool bVar2;
  vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_> *this_00;
  size_type sVar3;
  const_reference pvVar4;
  size_type local_50;
  size_t i;
  vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_> currentOp;
  vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_> *tokens;
  bool started;
  size_t startTokenIndex_local;
  wostream *stream_local;
  Generator *this_local;
  
  bVar2 = false;
  currentOp.super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)Tokenizer::tokens(this->m_tokenizer);
  std::vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>::vector
            ((vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_> *)&i);
  local_50 = startTokenIndex;
  while( true ) {
    this_00 = Tokenizer::tokens(this->m_tokenizer);
    sVar3 = std::vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>::size
                      (this_00);
    if (local_50 == sVar3) break;
    pvVar4 = std::vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>::
             operator[]((vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_> *)
                        currentOp.
                        super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,local_50);
    if (pvVar4->token == L'v') {
      bVar2 = true;
    }
    else if (bVar2) {
      pvVar4 = std::vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>::
               operator[]((vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_> *
                          )currentOp.
                           super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,local_50);
      if (pvVar4->token == L'}') break;
      pvVar4 = std::vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>::
               operator[]((vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_> *
                          )currentOp.
                           super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,local_50);
      if (pvVar4->token == L';') {
        bVar1 = std::vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>::empty
                          ((vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>
                            *)&i);
        if (!bVar1) {
          writeAssembledOperation
                    (this,stream,
                     (vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_> *)&i);
          std::vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>::clear
                    ((vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_> *)&i);
        }
      }
      else {
        pvVar4 = std::vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>::
                 operator[]((vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>
                             *)currentOp.
                               super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,local_50);
        std::vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>::push_back
                  ((vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_> *)&i,
                   pvVar4);
      }
    }
    local_50 = local_50 + 1;
  }
  bVar2 = std::vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>::empty
                    ((vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_> *)&i);
  if (!bVar2) {
    writeAssembledOperation
              (this,stream,
               (vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_> *)&i);
  }
  std::vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>::~vector
            ((vector<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_> *)&i);
  return;
}

Assistant:

void Generator::writeFunctionBody(std::wostream &stream, const size_t startTokenIndex)
{
    bool started = false;
    const std::vector<Token> &tokens = m_tokenizer.tokens();
    std::vector<Token> currentOp;
    for(size_t i = startTokenIndex; i != m_tokenizer.tokens().size(); ++i)
    {
        if (tokens[i].token == L'v')
        {
            started = true;
            continue;
        }
        if (!started)
            continue;
        //checking for end
        if (tokens[i].token == L'}')
            break;
        // splitting
        if (tokens[i].token == L';')
        {
            if (!currentOp.empty())
            {
                writeAssembledOperation(stream, currentOp);
                currentOp.clear();
            }
        }
        else
            currentOp.push_back(tokens[i]);
    }
    if (!currentOp.empty())
        writeAssembledOperation(stream, currentOp);
}